

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid)

{
  REF_STATUS RVar1;
  uint uVar2;
  int local_b4;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  uint local_34;
  double dStack_30;
  REF_INT cell;
  REF_DBL volume;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  volume = (REF_DBL)ref_grid->cell[8];
  if (ref_grid->twod != 0) {
    volume = (REF_DBL)ref_grid->cell[3];
  }
  local_34 = 0;
  ref_node = (REF_NODE)ref_grid;
  do {
    if (*(int *)((long)volume + 0x2c) <= (int)local_34) {
      return 0;
    }
    RVar1 = ref_cell_nodes((REF_CELL)volume,local_34,&ref_private_macro_code_rss_1);
    if (RVar1 == 0) {
      if ((int)ref_node[1].old_n_global == 0) {
        uVar2 = ref_node_tet_vol((REF_NODE)ref_cell,&ref_private_macro_code_rss_1,
                                 &stack0xffffffffffffffd0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1a5,"ref_validation_cell_volume",(ulong)uVar2,"vol");
          return uVar2;
        }
      }
      else {
        uVar2 = ref_node_tri_area((REF_NODE)ref_cell,&ref_private_macro_code_rss_1,
                                  &stack0xffffffffffffffd0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1a3,"ref_validation_cell_volume",(ulong)uVar2,"area");
          return uVar2;
        }
      }
      if (dStack_30 <= 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1ac,"ref_validation_cell_volume","negative volume tet");
        printf("cell %d volume %e\n",dStack_30,(ulong)local_34);
        for (local_b4 = 0; local_b4 < *(int *)((long)volume + 0xc); local_b4 = local_b4 + 1) {
          ref_node_location((REF_NODE)ref_cell,(&ref_private_macro_code_rss_1)[local_b4]);
        }
        return 1;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}